

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dept.h
# Opt level: O2

void __thiscall Department::print(Department *this,string *group_id,int day_id)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
  *__p;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
  element;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
  pStack_c8;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"dept_id: ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = std::operator!=(group_id,&default_group_abi_cxx11_);
  if (bVar1) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
                            *)(this + 0x20),group_id);
    Group::print(this_00,(int)group_id);
    return;
  }
  for (p_Var3 = *(_Rb_tree_node_base **)(this + 0x38); p_Var3 != (_Rb_tree_node_base *)(this + 0x28)
      ; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    __p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
           *)(p_Var3 + 1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_true>
              (&pStack_c8,__p);
    Group::print(&pStack_c8.second,(int)__p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>::
    ~pair(&pStack_c8);
  }
  return;
}

Assistant:

void Department::print(std::string group_id, int day_id) {

    //print a group
    std::cout << "dept_id: " << deptNumber << std::endl;
    if (group_id != default_group) {
        groups[group_id].print(day_id);
    }
    //print all groups
    else {

        for (std::pair<std::string, Group> element : groups) {
            element.second.print(day_id);
            std::cout << std::endl;
        }
    }

}